

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.hpp
# Opt level: O1

bool __thiscall
FastqReader<FastqRecord>::next_record(FastqReader<FastqRecord> *this,FastqRecord *rec)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  ulong uVar3;
  int iVar4;
  
  if (this->eof_flag != false) {
    return false;
  }
  do {
    iVar4 = kstream<gzFile_s_*,_FunctorZlib>::readFastq(this->ks,&this->seq);
    std::__cxx11::string::swap((string *)&rec->seq);
    std::__cxx11::string::swap((string *)&rec->qual);
    std::__cxx11::string::swap((string *)&rec->name);
    std::__cxx11::string::swap((string *)&rec->comment);
    uVar2 = this->numRecords;
    rec->id = uVar2;
    this->numRecords = uVar2 + 1;
    uVar3 = (rec->seq)._M_string_length;
    puVar1 = &(this->stats).totalLength;
    *puVar1 = *puVar1 + uVar3;
    if (iVar4 < 0) break;
  } while (uVar3 < (this->params).min_length);
  if (iVar4 < 0) {
    this->eof_flag = true;
  }
  else {
    puVar1 = &(this->stats).filteredRecords;
    *puVar1 = *puVar1 + 1;
    puVar1 = &(this->stats).filteredLength;
    *puVar1 = *puVar1 + uVar3;
  }
  return iVar4 >= 0;
}

Assistant:

bool next_record(FileRecord& rec) {
        int l;
        if ( eof_flag) return false;
        {
            do {
                l = (ks->readFastq(seq));
                std::swap(rec.seq, seq.seq);
                std::swap(rec.qual, seq.qual);
                std::swap(rec.name, seq.name);
                std::swap(rec.comment, seq.comment);
                rec.id = numRecords;
                numRecords++;

                stats.totalLength += rec.seq.size();
            } while (rec.seq.size() < params.min_length && l >= 0);
        }
        if (l<0) eof_flag=true;
        else {
            stats.filteredRecords++;
            stats.filteredLength += rec.seq.size();
        }

        return (l >= 0);
    }